

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

void __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this,
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  value_t vVar3;
  integer iVar4;
  
  vVar3 = v->type_;
  this->type_ = vVar3;
  (this->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (v->region_info_).
           super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (v->region_info_).
           super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->region_info_).super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      vVar3 = v->type_;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  switch(vVar3) {
  case boolean:
    (this->field_1).boolean_ = (v->field_1).boolean_;
    break;
  case floating:
    (this->field_1).integer_ = (v->field_1).integer_;
    break;
  case string:
    (this->field_1).boolean_ = (v->field_1).boolean_;
    (this->field_1).string_.str._M_dataplus._M_p = (pointer)((long)&this->field_1 + 0x18);
    pcVar2 = (v->field_1).string_.str._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&this->field_1 + 8),pcVar2,
               pcVar2 + (v->field_1).string_.str._M_string_length);
    break;
  case offset_datetime:
    pcVar2 = (v->field_1).string_.str._M_dataplus._M_p;
    (this->field_1).integer_ = (v->field_1).integer_;
    (this->field_1).string_.str._M_dataplus._M_p = pcVar2;
    break;
  case local_datetime:
    iVar4 = (v->field_1).integer_;
    *(undefined8 *)
     ((long)&(this->field_1).array_.ptr._M_t.
             super___uniq_ptr_impl<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
             .
             super__Head_base<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_false>
     + 6) = *(undefined8 *)
             ((long)&(v->field_1).array_.ptr._M_t.
                     super___uniq_ptr_impl<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_false>
             + 6);
LAB_001261c0:
    (this->field_1).integer_ = iVar4;
    break;
  case local_date:
    (this->field_1).offset_datetime_.date = (v->field_1).offset_datetime_.date;
    break;
  case local_time:
    (this->field_1).local_time_.nanosecond = (v->field_1).local_time_.nanosecond;
  case integer:
    iVar4 = (v->field_1).integer_;
    goto LAB_001261c0;
  case array:
    detail::
    storage<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
    ::storage((storage<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
               *)&(this->field_1).string_,
              (storage<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
               *)&(v->field_1).string_);
    break;
  case table:
    detail::
    storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
    ::storage((storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
               *)&(this->field_1).string_,
              (storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
               *)&(v->field_1).string_);
  }
  return;
}

Assistant:

basic_value(const basic_value& v)
        : type_(v.type()), region_info_(v.region_info_), comments_(v.comments_)
    {
        switch(v.type())
        {
            case value_t::boolean        : assigner(boolean_        , v.boolean_        ); break;
            case value_t::integer        : assigner(integer_        , v.integer_        ); break;
            case value_t::floating       : assigner(floating_       , v.floating_       ); break;
            case value_t::string         : assigner(string_         , v.string_         ); break;
            case value_t::offset_datetime: assigner(offset_datetime_, v.offset_datetime_); break;
            case value_t::local_datetime : assigner(local_datetime_ , v.local_datetime_ ); break;
            case value_t::local_date     : assigner(local_date_     , v.local_date_     ); break;
            case value_t::local_time     : assigner(local_time_     , v.local_time_     ); break;
            case value_t::array          : assigner(array_          , v.array_          ); break;
            case value_t::table          : assigner(table_          , v.table_          ); break;
            default: break;
        }
    }